

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_trie.c
# Opt level: O3

int ngram_model_trie_write_bin(ngram_model_t *base,char *path)

{
  uint uVar1;
  char **ppcVar2;
  char *__s;
  FILE *__s_00;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint32 count;
  int32 is_pipe;
  uint32 local_3c;
  int32 local_38;
  uint local_34;
  
  __s_00 = (FILE *)fopen_comp(path,"wb",&local_38);
  if (__s_00 == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
            ,0x1a9,"Unable to open %s to write binary trie LM\n",path);
    iVar4 = -1;
  }
  else {
    fwrite("Trie Language Model",1,0x13,__s_00);
    fputc((int)(char)base->n,__s_00);
    if (base->n != '\0') {
      uVar5 = 0;
      do {
        local_3c = base->n_counts[uVar5];
        fwrite(&local_3c,4,1,__s_00);
        uVar5 = uVar5 + 1;
      } while (uVar5 < base->n);
    }
    lm_trie_write_bin(*(lm_trie_t **)(base + 1),*base->n_counts,(FILE *)__s_00);
    uVar1 = *base->n_counts;
    if ((ulong)uVar1 == 0) {
      uVar6 = 0;
    }
    else {
      ppcVar2 = base->word_str;
      uVar5 = 0;
      uVar6 = 0;
      do {
        sVar3 = strlen(ppcVar2[uVar5]);
        uVar6 = uVar6 + (int)sVar3 + 1;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    iVar4 = 0;
    local_34 = uVar6;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
            ,0x199,"#word_str: %d\n",(ulong)uVar6);
    fwrite(&local_34,4,1,__s_00);
    if (*base->n_counts != 0) {
      uVar5 = 0;
      do {
        __s = base->word_str[uVar5];
        sVar3 = strlen(__s);
        fwrite(__s,1,sVar3 + 1,__s_00);
        uVar5 = uVar5 + 1;
      } while (uVar5 < *base->n_counts);
    }
    fclose_comp((FILE *)__s_00,local_38);
  }
  return iVar4;
}

Assistant:

int
ngram_model_trie_write_bin(ngram_model_t * base, const char *path)
{
    int i;
    int32 is_pipe;
    ngram_model_trie_t *model = (ngram_model_trie_t *) base;
    FILE *fp = fopen_comp(path, "wb", &is_pipe);
    if (!fp) {
        E_ERROR("Unable to open %s to write binary trie LM\n", path);
        return -1;
    }

    fwrite(trie_hdr, sizeof(*trie_hdr), strlen(trie_hdr), fp);
    fwrite(&model->base.n, sizeof(model->base.n), 1, fp);
    for (i = 0; i < model->base.n; i++) {
        uint32 count = model->base.n_counts[i];
        if (SWAP_LM_TRIE)
            SWAP_INT32(&count);
        fwrite(&count, sizeof(count), 1, fp);
    }
    lm_trie_write_bin(model->trie, base->n_counts[0], fp);
    write_word_str(fp, base, SWAP_LM_TRIE);
    fclose_comp(fp, is_pipe);
    return 0;
}